

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t __n;
  seq_t sequence;
  seq_t sequence_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  BYTE *op_2;
  size_t sVar8;
  size_t sVar9;
  ulong *puVar10;
  size_t sVar11;
  byte bVar12;
  byte *oend_00;
  long lVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  BYTE *oend;
  ulong *puVar19;
  ZSTD_seqSymbol ZVar20;
  byte *pbVar21;
  byte *pbVar22;
  long *plVar23;
  ZSTD_seqSymbol ZVar24;
  byte *pbVar25;
  byte *pbVar26;
  ZSTD_seqSymbol ZVar27;
  ZSTD_seqSymbol ZVar28;
  ulong uVar29;
  byte *pbVar30;
  ulong *puVar31;
  BYTE *pBVar32;
  size_t __n_00;
  size_t srcSize_00;
  ulong uVar33;
  BYTE *op;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffdd8;
  ZSTD_seqSymbol local_1e8;
  BYTE *local_1b8;
  byte *local_1b0;
  uint local_1a8;
  uint local_1a4;
  ZSTD_seqSymbol *local_1a0;
  BIT_DStream_t local_198;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  ZSTD_fseState local_150;
  ZSTD_seqSymbol local_140 [3];
  byte *local_128 [3];
  ulong *local_110;
  byte *local_108;
  byte *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  ulong *local_e8;
  ulong *local_e0;
  byte *local_d8;
  ZSTD_seqSymbol local_d0;
  byte *local_c8;
  byte *local_c0;
  ZSTD_seqSymbol local_b8;
  size_t local_b0;
  ZSTD_seqSymbol local_a8;
  long local_a0 [14];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar8 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  srcSize_00 = srcSize - sVar8;
  iVar5 = dctx->ddictIsCold;
  sVar9 = ZSTD_decodeSeqHeaders(dctx,(int *)&local_1a4,(void *)(sVar8 + (long)src),srcSize_00);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  puVar19 = (ulong *)((long)(sVar8 + (long)src) + sVar9);
  sVar8 = srcSize_00 - sVar9;
  if (iVar5 == 0) {
    if (frame == 0) {
      if ((int)local_1a4 < 5) goto LAB_004137f3;
    }
    else if ((dctx->fParams).windowSize < 0x1000001 || (int)local_1a4 < 5) {
LAB_004137f3:
      dctx->ddictIsCold = 0;
      goto LAB_004137fe;
    }
    iVar5 = 0;
    uVar6 = 1;
    do {
      iVar5 = (iVar5 + 1) - (uint)(dctx->OFTptr[(ulong)(uVar6 - 1) + 1].nbAdditionalBits < 0x17);
      bVar12 = (byte)dctx->OFTptr->baseValue;
      uVar4 = uVar6 >> (bVar12 & 0x1f);
      uVar6 = uVar6 + 1;
    } while (uVar4 == 0);
    dctx->ddictIsCold = 0;
    if ((uint)(iVar5 << (8 - bVar12 & 0x1f)) < 7) {
LAB_004137fe:
      sVar8 = ZSTD_decompressSequences
                        (dctx,dst,dstCapacity,puVar19,sVar8,local_1a4,in_stack_fffffffffffffdd8);
      return sVar8;
    }
  }
  else {
    dctx->ddictIsCold = 0;
  }
  oend_00 = (byte *)(dstCapacity + (long)dst);
  local_1b8 = dctx->litPtr;
  sVar3 = dctx->litSize;
  pBVar32 = local_1b8 + sVar3;
  op = (BYTE *)dst;
  if (local_1a4 == 0) {
LAB_0041474a:
    uVar33 = (long)pBVar32 - (long)local_1b8;
    if (uVar33 <= (ulong)((long)oend_00 - (long)op)) {
      memcpy(op,local_1b8,uVar33);
      return (size_t)(op + (uVar33 - (long)dst));
    }
    return 0xffffffffffffffba;
  }
  local_1b0 = (byte *)dctx->prefixStart;
  local_f0 = (BYTE *)dctx->virtualStart;
  local_128[1] = (byte *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar13 = -0xc;
  do {
    *(ulong *)((long)local_128 + lVar13 * 2) = (ulong)*(uint *)((long)dctx->workspace + lVar13);
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0);
  local_1a8 = 4;
  if ((int)local_1a4 < 4) {
    local_1a8 = local_1a4;
  }
  local_128[2] = (byte *)((long)dst - (long)local_1b0);
  if (srcSize_00 == sVar9) {
    return 0xffffffffffffffec;
  }
  local_198.limitPtr = (char *)(puVar19 + 1);
  if (sVar8 < 8) {
    local_198.bitContainer = (size_t)(byte)*puVar19;
    switch(sVar8) {
    case 7:
      local_198.bitContainer = local_198.bitContainer | (ulong)*(byte *)((long)puVar19 + 6) << 0x30;
    case 6:
      local_198.bitContainer =
           local_198.bitContainer + ((ulong)*(byte *)((long)puVar19 + 5) << 0x28);
    case 5:
      local_198.bitContainer =
           local_198.bitContainer + ((ulong)*(byte *)((long)puVar19 + 4) << 0x20);
    case 4:
      local_198.bitContainer =
           local_198.bitContainer + (ulong)*(byte *)((long)puVar19 + 3) * 0x1000000;
    case 3:
      local_198.bitContainer =
           local_198.bitContainer + (ulong)*(byte *)((long)puVar19 + 2) * 0x10000;
    case 2:
      local_198.bitContainer = (ulong)*(byte *)((long)puVar19 + 1) * 0x100 + local_198.bitContainer;
    }
    bVar12 = *(byte *)((long)src + (srcSize - 1));
    if (bVar12 == 0) {
      return 0xffffffffffffffec;
    }
    uVar6 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    local_198.bitsConsumed = (uVar6 ^ 0x1f) + (int)sVar8 * -8 + 0x29;
    local_198.ptr = (char *)puVar19;
  }
  else {
    local_198.ptr = (char *)((long)src + (srcSize - 8));
    local_198.bitContainer = *(size_t *)local_198.ptr;
    if (local_198.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffec;
    }
    uVar6 = 0x1f;
    bVar12 = (byte)(local_198.bitContainer >> 0x38);
    if (bVar12 != 0) {
      for (; bVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    local_198.bitsConsumed = ~uVar6 + 9;
    if (0xffffffffffffff88 < sVar8) {
      return 0xffffffffffffffec;
    }
  }
  local_198.start = (char *)puVar19;
  local_128[0] = local_1b0;
  local_100 = local_128[1];
  local_f8 = local_1b8 + sVar3;
  ZSTD_initFseState(&local_170,&local_198,dctx->LLTptr);
  ZSTD_initFseState(&local_160,&local_198,dctx->OFTptr);
  ZSTD_initFseState(&local_150,&local_198,dctx->MLTptr);
  uVar33 = (ulong)local_198.bitsConsumed;
  uVar14 = 0;
  if (local_198.bitsConsumed < 0x41) {
    local_e8 = (ulong *)local_198.limitPtr;
    local_110 = (ulong *)local_198.start;
    local_1a0 = local_160.table;
    local_c0 = local_128[1];
    local_c8 = local_128[0];
    local_d8 = (byte *)0x0;
    uVar14 = 0;
    if (0 < (int)local_1a8) {
      uVar14 = (ulong)local_1a8;
    }
    local_d0 = local_140[1];
    plVar23 = local_a0;
    local_e0 = (ulong *)local_198.ptr;
    ZVar28 = local_140[0];
    uVar17 = local_198.bitContainer;
    do {
      if (local_e0 < local_198.limitPtr) {
        if (local_e0 != (ulong *)local_198.start) {
          uVar17 = (ulong)(uint)((int)local_e0 - (int)local_198.start);
          if (local_198.start <= (ulong *)((long)local_e0 - (uVar33 >> 3))) {
            uVar17 = uVar33 >> 3;
          }
          local_198.bitsConsumed = (uint)uVar33 + (int)uVar17 * -8;
          goto LAB_00413a50;
        }
      }
      else {
        uVar17 = uVar33 >> 3;
        local_198.bitsConsumed = (uint)uVar33 & 7;
LAB_00413a50:
        local_e0 = (ulong *)((long)local_e0 - uVar17);
        uVar33 = (ulong)local_198.bitsConsumed;
        uVar17 = *local_e0;
        local_198.bitContainer = uVar17;
        local_198.ptr = (char *)local_e0;
      }
      if ((byte *)uVar14 == local_d8) goto LAB_00413d57;
      bVar12 = local_170.table[local_170.state].nbAdditionalBits;
      bVar1 = local_150.table[local_150.state].nbAdditionalBits;
      bVar2 = local_160.table[local_160.state].nbAdditionalBits;
      local_108 = (byte *)(ulong)local_150.table[local_150.state].baseValue;
      uVar6 = (uint)bVar2;
      if (bVar2 != 0) {
        ZVar27 = (ZSTD_seqSymbol)
                 (((uVar17 << ((byte)uVar33 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_160.table[local_160.state].baseValue);
        uVar33 = (ulong)((int)uVar33 + uVar6);
        if (uVar6 == 1) goto LAB_00413af0;
        goto LAB_00413b32;
      }
      ZVar27.nextState = 0;
      ZVar27.nbAdditionalBits = '\0';
      ZVar27.nbBits = '\0';
      ZVar27.baseValue = 0;
LAB_00413af0:
      pbVar15 = (byte *)((ulong)((ulong)local_170.table[local_170.state].baseValue == 0) +
                        (long)ZVar27);
      if (pbVar15 != (byte *)0x0) {
        if (pbVar15 == (byte *)0x3) {
          ZVar27 = (ZSTD_seqSymbol)
                   ((long)((long)ZVar28 + -1) + (ulong)(ZVar28 == (ZSTD_seqSymbol)0x1));
LAB_00413b32:
          local_140[2] = local_d0;
        }
        else {
          ZVar27 = (ZSTD_seqSymbol)
                   ((long)local_140[(long)pbVar15] +
                   (ulong)(local_140[(long)pbVar15] == (ZSTD_seqSymbol)0x0));
          if (pbVar15 != (byte *)0x1) goto LAB_00413b32;
        }
        local_140[1] = ZVar28;
        local_140[0] = ZVar27;
        local_d0 = ZVar28;
        ZVar28 = ZVar27;
      }
      if (bVar1 == 0) {
        uVar29 = 0;
      }
      else {
        uVar29 = (uVar17 << ((byte)uVar33 & 0x3f)) >> (-bVar1 & 0x3f);
        uVar33 = (ulong)((int)uVar33 + (uint)bVar1);
      }
      uVar4 = (uint)uVar33;
      if ((0x1e < (uint)bVar1 + (uint)bVar12 + uVar6) && (uVar4 < 0x41)) {
        if (local_e0 < local_198.limitPtr) {
          if (local_e0 == (ulong *)local_198.start) goto LAB_00413bef;
          uVar17 = (ulong)(uint)((int)local_e0 - (int)local_198.start);
          if (local_198.start <= (ulong *)((long)local_e0 - (uVar33 >> 3))) {
            uVar17 = uVar33 >> 3;
          }
          uVar4 = uVar4 + (int)uVar17 * -8;
        }
        else {
          uVar17 = uVar33 >> 3;
          uVar4 = uVar4 & 7;
        }
        local_e0 = (ulong *)((long)local_e0 - uVar17);
        uVar17 = *local_e0;
        local_198.bitContainer = uVar17;
        local_198.ptr = (char *)local_e0;
      }
LAB_00413bef:
      if (bVar12 == 0) {
        uVar33 = 0;
      }
      else {
        uVar33 = (uVar17 << ((byte)uVar4 & 0x3f)) >> (-bVar12 & 0x3f);
        uVar4 = uVar4 + bVar12;
      }
      pbVar30 = (byte *)(ulong)local_150.table[local_150.state].baseValue + uVar29;
      lVar13 = uVar33 + local_170.table[local_170.state].baseValue;
      ZVar27 = (ZSTD_seqSymbol)((long)local_128[2] + lVar13);
      pbVar15 = local_c8;
      if ((ulong)ZVar27 < (ulong)ZVar28) {
        pbVar15 = local_128[1];
      }
      local_128[2] = pbVar30 + (long)ZVar27;
      iVar5 = uVar4 + local_170.table[local_170.state].nbBits;
      local_170.state =
           (ulong)((uint)(uVar17 >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[local_170.table[local_170.state].nbBits]) +
           (ulong)local_170.table[local_170.state].nextState;
      iVar5 = iVar5 + (uint)local_150.table[local_150.state].nbBits;
      local_150.state =
           (ulong)((uint)(uVar17 >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[local_150.table[local_150.state].nbBits]) +
           (ulong)local_150.table[local_150.state].nextState;
      local_198.bitsConsumed = iVar5 + (uint)local_160.table[local_160.state].nbBits;
      uVar33 = (ulong)local_198.bitsConsumed;
      local_160.state =
           (ulong)((uint)(uVar17 >> (-(char)local_198.bitsConsumed & 0x3fU)) &
                  BIT_mask[local_160.table[local_160.state].nbBits]) +
           (ulong)local_160.table[local_160.state].nextState;
      plVar23[-3] = lVar13;
      plVar23[-2] = (long)pbVar30;
      *(ZSTD_seqSymbol *)(plVar23 + -1) = ZVar28;
      *plVar23 = (long)(pbVar15 + ((long)ZVar27 - (long)ZVar28));
      local_d8 = (byte *)((long)local_d8 + 1);
      plVar23 = plVar23 + 4;
    } while (local_198.bitsConsumed < 0x41);
    uVar14 = (ulong)local_d8 & 0xffffffff;
  }
  if ((int)local_1a8 <= (int)uVar14) {
LAB_00413d57:
    local_d8 = oend_00 + -8;
    local_e0 = (ulong *)(oend_00 + -0xd);
    while( true ) {
      pbVar15 = local_d8;
      ZVar28 = local_140[1];
      uVar6 = (uint)uVar33;
      uVar4 = (uint)uVar14;
      if (0x40 < uVar6) break;
      if (local_198.ptr < local_198.limitPtr) {
        if (local_198.ptr != local_198.start) {
          uVar14 = (ulong)(uint)((int)local_198.ptr - (int)local_198.start);
          if (local_198.start <= (ulong *)((long)local_198.ptr - (uVar33 >> 3))) {
            uVar14 = uVar33 >> 3;
          }
          local_198.bitsConsumed = uVar6 + (int)uVar14 * -8;
          goto LAB_00413ddf;
        }
      }
      else {
        uVar14 = uVar33 >> 3;
        local_198.bitsConsumed = uVar6 & 7;
LAB_00413ddf:
        local_198.ptr = (char *)((long)local_198.ptr - uVar14);
        uVar33 = (ulong)local_198.bitsConsumed;
        local_198.bitContainer = *(size_t *)local_198.ptr;
      }
      if ((int)local_1a4 <= (int)uVar4) goto LAB_00414425;
      bVar12 = local_170.table[local_170.state].nbAdditionalBits;
      bVar1 = local_150.table[local_150.state].nbAdditionalBits;
      bVar2 = local_160.table[local_160.state].nbAdditionalBits;
      uVar6 = (uint)bVar2;
      if (bVar2 == 0) {
        ZVar20.nextState = 0;
        ZVar20.nbAdditionalBits = '\0';
        ZVar20.nbBits = '\0';
        ZVar20.baseValue = 0;
LAB_00413eb3:
        pbVar30 = (byte *)((ulong)((ulong)local_170.table[local_170.state].baseValue == 0) +
                          (long)ZVar20);
        if (pbVar30 != (byte *)0x0) {
          if (pbVar30 == (byte *)0x3) {
            local_1e8 = (ZSTD_seqSymbol)
                        ((long)((long)local_140[0] + -1) +
                        (ulong)(local_140[0] == (ZSTD_seqSymbol)0x1));
LAB_00413f0e:
            local_140[2] = local_140[1];
          }
          else {
            local_1e8 = (ZSTD_seqSymbol)
                        ((long)local_140[(long)pbVar30] +
                        (ulong)(local_140[(long)pbVar30] == (ZSTD_seqSymbol)0x0));
            if (pbVar30 != (byte *)0x1) goto LAB_00413f0e;
          }
          local_140[1] = local_140[0];
          local_140[0] = local_1e8;
        }
      }
      else {
        ZVar20 = (ZSTD_seqSymbol)
                 (((local_198.bitContainer << ((byte)uVar33 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_160.table[local_160.state].baseValue);
        uVar33 = (ulong)((int)uVar33 + uVar6);
        if (uVar6 == 1) goto LAB_00413eb3;
        local_140[1] = local_140[0];
        local_140[2] = ZVar28;
        local_140[0] = ZVar20;
      }
      ZVar28 = local_140[0];
      if (bVar1 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (local_198.bitContainer << ((byte)uVar33 & 0x3f)) >> (-bVar1 & 0x3f);
        uVar33 = (ulong)((int)uVar33 + (uint)bVar1);
      }
      uVar7 = (uint)uVar33;
      if ((0x1e < (uint)bVar1 + (uint)bVar12 + uVar6) && (uVar7 < 0x41)) {
        if (local_198.ptr < local_198.limitPtr) {
          if (local_198.ptr == local_198.start) goto LAB_00413fea;
          uVar17 = (ulong)(uint)((int)local_198.ptr - (int)local_198.start);
          if (local_198.start <= (ulong *)((long)local_198.ptr - (uVar33 >> 3))) {
            uVar17 = uVar33 >> 3;
          }
          uVar7 = uVar7 + (int)uVar17 * -8;
        }
        else {
          uVar17 = uVar33 >> 3;
          uVar7 = uVar7 & 7;
        }
        local_198.ptr = (char *)((long)local_198.ptr - uVar17);
        local_198.bitContainer = *(size_t *)local_198.ptr;
      }
LAB_00413fea:
      if (bVar12 == 0) {
        uVar33 = 0;
      }
      else {
        uVar33 = (local_198.bitContainer << ((byte)uVar7 & 0x3f)) >> (-bVar12 & 0x3f);
        uVar7 = uVar7 + bVar12;
      }
      ZVar20 = (ZSTD_seqSymbol)(uVar14 + local_150.table[local_150.state].baseValue);
      ZVar24 = (ZSTD_seqSymbol)(uVar33 + local_170.table[local_170.state].baseValue);
      ZVar27 = (ZSTD_seqSymbol)((long)local_128[2] + (long)ZVar24);
      pbVar26 = local_128[(ulong)ZVar27 < (ulong)local_140[0]];
      local_128[2] = (byte *)((long)ZVar27 + (long)ZVar20);
      iVar5 = uVar7 + local_170.table[local_170.state].nbBits;
      local_170.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[local_170.table[local_170.state].nbBits]) +
           (ulong)local_170.table[local_170.state].nextState;
      iVar5 = iVar5 + (uint)local_150.table[local_150.state].nbBits;
      local_150.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)iVar5 & 0x3fU)) &
                  BIT_mask[local_150.table[local_150.state].nbBits]) +
           (ulong)local_150.table[local_150.state].nextState;
      local_198.bitsConsumed = iVar5 + (uint)local_160.table[local_160.state].nbBits;
      local_160.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)local_198.bitsConsumed & 0x3fU)) &
                  BIT_mask[local_160.table[local_160.state].nbBits]) +
           (ulong)local_160.table[local_160.state].nextState;
      uVar14 = (ulong)((uVar4 & 3) << 5);
      uVar33 = *(ulong *)((long)&local_b8.nextState + uVar14);
      puVar19 = *(ulong **)((long)&local_b0 + uVar14);
      pbVar30 = (byte *)((long)puVar19 + uVar33);
      pbVar22 = op + (long)pbVar30;
      if (oend_00 < pbVar22) {
        return 0xffffffffffffffba;
      }
      pBVar32 = local_1b8 + uVar33;
      if (local_f8 < pBVar32) {
        return 0xffffffffffffffec;
      }
      local_1a0 = (ZSTD_seqSymbol *)((long)&local_b8.nextState + uVar14);
      pbVar21 = op + uVar33;
      if (local_d8 < pbVar21) {
        sequence.matchLength = *(undefined8 *)((long)&local_b0 + uVar14);
        sequence.litLength._0_2_ = local_1a0->nextState;
        sequence.litLength._2_1_ = local_1a0->nbAdditionalBits;
        sequence.litLength._3_1_ = local_1a0->nbBits;
        sequence.litLength._4_4_ = local_1a0->baseValue;
        sequence.offset = *(undefined8 *)((long)local_a0 + (uVar14 - 8));
        sequence.match = *(BYTE **)((long)local_a0 + uVar14);
        pbVar30 = (byte *)ZSTD_execSequenceLast7
                                    (op,oend_00,sequence,&local_1b8,local_f8,local_1b0,local_f0,
                                     local_100);
      }
      else {
        puVar31 = *(ulong **)((long)local_a0 + (uVar14 - 8));
        pbVar25 = *(byte **)((long)local_a0 + uVar14);
        *(undefined8 *)op = *(undefined8 *)local_1b8;
        if (8 < uVar33) {
          pbVar16 = op + 8;
          do {
            local_1b8 = local_1b8 + 8;
            *(undefined8 *)pbVar16 = *(undefined8 *)local_1b8;
            pbVar16 = pbVar16 + 8;
          } while (pbVar16 < pbVar21);
        }
        puVar10 = puVar19;
        local_1b8 = pBVar32;
        if (pbVar21 + -(long)local_1b0 < puVar31) {
          if (pbVar21 + -(long)local_f0 < puVar31) {
            return 0xffffffffffffffec;
          }
          local_108 = pbVar30;
          if (local_100 < pbVar25 + (long)puVar19) {
            local_e8 = (ulong *)(local_100 + -(long)pbVar25);
            local_110 = puVar31;
            memmove(pbVar21,pbVar25,(size_t)local_e8);
            pbVar21 = pbVar21 + (long)local_e8;
            puVar10 = (ulong *)((long)puVar19 - (long)local_e8);
            pbVar30 = local_108;
            if ((pbVar21 <= pbVar15) &&
               (pbVar25 = local_1b0, puVar31 = local_110, (ulong *)0x2 < puVar10))
            goto LAB_0041429c;
            if (puVar19 != local_e8) {
              uVar33 = 0;
              do {
                pbVar21[uVar33] = local_1b0[uVar33];
                uVar33 = uVar33 + 1;
              } while ((ulong *)(uVar33 & 0xffffffff) < puVar10);
            }
          }
          else {
            memmove(pbVar21,pbVar25,(size_t)puVar19);
            pbVar30 = local_108;
          }
        }
        else {
LAB_0041429c:
          if (puVar31 < (ulong *)0x8) {
            iVar5 = *(int *)(ZSTD_execSequence_dec64table + (long)puVar31 * 4);
            *pbVar21 = *pbVar25;
            pbVar21[1] = pbVar25[1];
            pbVar21[2] = pbVar25[2];
            pbVar21[3] = pbVar25[3];
            pbVar16 = pbVar25 + *(uint *)(ZSTD_execSequence_dec32table + (long)puVar31 * 4);
            pbVar25 = pbVar25 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + (long)puVar31 * 4)
                                - (long)iVar5);
            *(undefined4 *)(pbVar21 + 4) = *(undefined4 *)pbVar16;
          }
          else {
            *(undefined8 *)pbVar21 = *(undefined8 *)pbVar25;
          }
          pbVar16 = pbVar21 + 8;
          pbVar25 = pbVar25 + 8;
          if (local_e0 < pbVar22) {
            pbVar21 = pbVar16;
            pbVar18 = pbVar25;
            if (pbVar16 < pbVar15) {
              do {
                *(undefined8 *)pbVar21 = *(undefined8 *)pbVar18;
                pbVar21 = pbVar21 + 8;
                pbVar18 = pbVar18 + 8;
              } while (pbVar21 < pbVar15);
              pbVar25 = pbVar25 + ((long)pbVar15 - (long)pbVar16);
              pbVar16 = pbVar15;
            }
            for (; pbVar16 < pbVar22; pbVar16 = pbVar16 + 1) {
              bVar12 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              *pbVar16 = bVar12;
            }
          }
          else {
            do {
              *(undefined8 *)pbVar16 = *(undefined8 *)pbVar25;
              pbVar16 = pbVar16 + 8;
              pbVar25 = pbVar25 + 8;
            } while (pbVar16 < pbVar21 + (long)puVar10);
          }
        }
      }
      if ((byte *)0xffffffffffffff88 < pbVar30) {
        return (size_t)pbVar30;
      }
      *local_1a0 = ZVar24;
      local_1a0[1] = ZVar20;
      local_1a0[2] = ZVar28;
      local_1a0[3] = (ZSTD_seqSymbol)((long)pbVar26 + ((long)ZVar27 - (long)ZVar28));
      op = op + (long)pbVar30;
      uVar14 = (ulong)(uVar4 + 1);
      uVar33 = (ulong)local_198.bitsConsumed;
    }
    if ((int)local_1a4 <= (int)uVar4) {
LAB_00414425:
      uVar4 = uVar4 - local_1a8;
      if ((int)uVar4 < (int)local_1a4) {
        pbVar15 = oend_00 + -8;
        do {
          uVar17 = (ulong)((uVar4 & 3) << 5);
          uVar14 = *(ulong *)((long)&local_b8.nextState + uVar17);
          __n = *(size_t *)((long)&local_b0 + uVar17);
          uVar33 = __n + uVar14;
          pbVar30 = op + uVar33;
          if (oend_00 < pbVar30) {
            return 0xffffffffffffffba;
          }
          pBVar32 = local_1b8 + uVar14;
          if (local_f8 < pBVar32) {
            return 0xffffffffffffffec;
          }
          pbVar22 = op + uVar14;
          if (pbVar15 < pbVar22) {
            sequence_00.matchLength = *(undefined8 *)((long)&local_b0 + uVar17);
            sequence_00.litLength = *(undefined8 *)((long)&local_b8.nextState + uVar17);
            sequence_00.offset = *(undefined8 *)((long)local_a0 + (uVar17 - 8));
            sequence_00.match = *(BYTE **)((long)local_a0 + uVar17);
            uVar33 = ZSTD_execSequenceLast7
                               (op,oend_00,sequence_00,&local_1b8,local_f8,local_1b0,local_f0,
                                local_100);
          }
          else {
            uVar29 = *(ulong *)((long)local_a0 + (uVar17 - 8));
            pbVar26 = *(byte **)((long)local_a0 + uVar17);
            *(undefined8 *)op = *(undefined8 *)local_1b8;
            if (8 < uVar14) {
              pbVar21 = op + 8;
              do {
                local_1b8 = local_1b8 + 8;
                *(undefined8 *)pbVar21 = *(undefined8 *)local_1b8;
                pbVar21 = pbVar21 + 8;
              } while (pbVar21 < pbVar22);
            }
            sVar11 = __n;
            local_1b8 = pBVar32;
            if ((ulong)((long)pbVar22 - (long)local_1b0) < uVar29) {
              if ((ulong)((long)pbVar22 - (long)local_f0) < uVar29) {
                return 0xffffffffffffffec;
              }
              if (local_100 < pbVar26 + __n) {
                __n_00 = (long)local_100 - (long)pbVar26;
                memmove(pbVar22,pbVar26,__n_00);
                pbVar22 = pbVar22 + __n_00;
                sVar11 = __n - __n_00;
                if ((pbVar22 <= pbVar15) && (pbVar26 = local_1b0, 2 < sVar11)) goto LAB_004145da;
                if (__n != __n_00) {
                  uVar14 = 0;
                  do {
                    pbVar22[uVar14] = local_1b0[uVar14];
                    uVar14 = uVar14 + 1;
                  } while ((uVar14 & 0xffffffff) < sVar11);
                }
              }
              else {
                memmove(pbVar22,pbVar26,__n);
              }
            }
            else {
LAB_004145da:
              if (uVar29 < 8) {
                iVar5 = *(int *)(ZSTD_execSequence_dec64table + uVar29 * 4);
                *pbVar22 = *pbVar26;
                pbVar22[1] = pbVar26[1];
                pbVar22[2] = pbVar26[2];
                pbVar22[3] = pbVar26[3];
                pbVar21 = pbVar26 + *(uint *)(ZSTD_execSequence_dec32table + uVar29 * 4);
                pbVar26 = pbVar26 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar29 * 4) -
                                    (long)iVar5);
                *(undefined4 *)(pbVar22 + 4) = *(undefined4 *)pbVar21;
              }
              else {
                *(undefined8 *)pbVar22 = *(undefined8 *)pbVar26;
              }
              pbVar21 = pbVar22 + 8;
              pbVar26 = pbVar26 + 8;
              if (local_e0 < pbVar30) {
                pbVar22 = pbVar21;
                pbVar25 = pbVar26;
                if (pbVar21 < pbVar15) {
                  do {
                    *(undefined8 *)pbVar22 = *(undefined8 *)pbVar25;
                    pbVar22 = pbVar22 + 8;
                    pbVar25 = pbVar25 + 8;
                  } while (pbVar22 < pbVar15);
                  pbVar26 = pbVar26 + ((long)pbVar15 - (long)pbVar21);
                  pbVar21 = pbVar15;
                }
                for (; pbVar21 < pbVar30; pbVar21 = pbVar21 + 1) {
                  bVar12 = *pbVar26;
                  pbVar26 = pbVar26 + 1;
                  *pbVar21 = bVar12;
                }
              }
              else {
                do {
                  *(undefined8 *)pbVar21 = *(undefined8 *)pbVar26;
                  pbVar21 = pbVar21 + 8;
                  pbVar26 = pbVar26 + 8;
                } while (pbVar21 < pbVar22 + sVar11);
              }
            }
          }
          if (0xffffffffffffff88 < uVar33) {
            return uVar33;
          }
          op = op + uVar33;
          uVar4 = uVar4 + 1;
        } while (uVar4 != local_1a4);
      }
      lVar13 = 0;
      do {
        (dctx->entropy).rep[lVar13] = *(U32 *)(local_140 + lVar13);
        lVar13 = lVar13 + 1;
        pBVar32 = local_f8;
      } while (lVar13 != 3);
      goto LAB_0041474a;
    }
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}